

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

char ** gen_options(uint program)

{
  uint uVar1;
  option_type_t oVar2;
  ulong uVar3;
  char **ptr;
  char *pcVar4;
  size_t sVar5;
  char *__dest;
  ushort **ppuVar6;
  ulong uVar7;
  ulong uVar8;
  option_t *poVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  char buf [4096];
  char local_1038 [4104];
  
  if (program == 0) {
    ptr = (char **)0x0;
  }
  else {
    ptr = (char **)mmalloc(0x10);
    pcVar4 = (char *)mmalloc(5);
    *ptr = pcVar4;
    ptr[1] = (char *)0x0;
    if (program == 1) {
      builtin_strncpy(pcVar4,"gbas",5);
    }
    else {
      builtin_strncpy(pcVar4,"gbld",5);
    }
    uVar11 = 1;
    lVar12 = 0;
    do {
      uVar1 = uVar11;
      if (((options[lVar12].set != 0) &&
          ((poVar9 = options + lVar12, program != 1 || (options[lVar12].as_opt != 0)))) &&
         ((program != 2 || (options[lVar12].ld_opt != 0)))) {
        uVar10 = uVar11 + 1;
        uVar1 = uVar11 + 2;
        ptr = (char **)mrealloc(ptr,(ulong)uVar1 * 8);
        ptr[uVar10] = (char *)0x0;
        oVar2 = options[lVar12].type;
        if (oVar2 == string) {
          ptr = (char **)mrealloc(ptr,(ulong)(uVar11 + 3) << 3);
          ptr[uVar1] = (char *)0x0;
          pcVar4 = options[lVar12].value.str;
          sVar5 = strlen(pcVar4);
          if (sVar5 != 0) {
            ppuVar6 = __ctype_b_loc();
            uVar3 = 1;
            uVar8 = 0;
            do {
              uVar7 = uVar3;
              if ((*(byte *)((long)*ppuVar6 + (long)pcVar4[uVar8] * 2 + 1) & 0x20) != 0) {
                sprintf(local_1038,"\"%s\"",pcVar4);
                goto LAB_00108e5d;
              }
              uVar3 = (ulong)((int)uVar7 + 1);
              uVar8 = uVar7;
            } while (uVar7 < sVar5);
          }
          strcpy(local_1038,pcVar4);
LAB_00108e5d:
          sVar5 = strlen(poVar9->name);
          pcVar4 = (char *)mmalloc(sVar5 + 1);
          ptr[uVar11] = pcVar4;
          sVar5 = strlen(local_1038);
          pcVar4 = (char *)mmalloc(sVar5 + 1);
          ptr[uVar10] = pcVar4;
          strcpy(ptr[uVar11],poVar9->name);
          strcpy(ptr[uVar10],local_1038);
        }
        else {
          uVar1 = uVar10;
          if (oVar2 == number) {
            pcVar4 = local_1038;
            sprintf(pcVar4,"%s%d",poVar9->name,(ulong)(uint)options[lVar12].value.num);
            sVar5 = strlen(pcVar4);
            __dest = (char *)mmalloc(sVar5 + 1);
            ptr[uVar11] = __dest;
          }
          else {
            if (oVar2 != flag) goto LAB_00108ec3;
            sVar5 = strlen(poVar9->name);
            __dest = (char *)mmalloc(sVar5 + 1);
            ptr[uVar11] = __dest;
            pcVar4 = poVar9->name;
          }
          strcpy(__dest,pcVar4);
        }
      }
LAB_00108ec3:
      uVar11 = uVar1;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 8);
  }
  return ptr;
}

Assistant:

char** gen_options(unsigned program)
{
    unsigned i, num_opts = 1;
    char buf[PATH_MAX];
    
    if (program == GBCC)
        return NULL;
    char** opts = (char**)mmalloc((num_opts+1) * sizeof(char*));
    opts[0] = (char*)mmalloc(5);
    opts[1] = NULL;
    
    if (program == GBAS)
        strcpy(opts[0], "gbas");
    else
        strcpy(opts[0], "gbld");
    
    for (i = 0; i < NUM_OPTIONS; ++i)
    {
        if (!options[i].set)
            continue;
        if (program == GBAS && !options[i].as_opt)
            continue;
        if (program == GBLD && !options[i].ld_opt)
            continue;
        
        opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
        opts[num_opts] = NULL;
        
        if (options[i].type == flag)    /* -opt */
        {
            opts[num_opts-1] = (char*)mmalloc(strlen(options[i].name) + 1);
            strcpy(opts[num_opts-1], options[i].name);
        }
        else if (options[i].type == number) /* -opt=<number> */
        {
            sprintf(buf, "%s%d", options[i].name, options[i].value.num);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            strcpy(opts[num_opts-1], buf);
        }
        else if (options[i].type == string) /* -opt <string> */
        {
            unsigned j;
            int delim = 0;
            
            opts = (char**)mrealloc(opts, (++num_opts+1) * sizeof(char*));
            opts[num_opts] = NULL;
            
            for (j = 0; j < strlen(options[i].value.str); ++j)
            {
                if (isspace(options[i].value.str[j]))
                {
                    delim = 1;
                    break;
                }
            }
            
            if (delim)
                sprintf(buf, "\"%s\"", options[i].value.str);
            else
                strcpy(buf, options[i].value.str);
            
            opts[num_opts-2] = (char*)mmalloc(strlen(options[i].name) + 1);
            opts[num_opts-1] = (char*)mmalloc(strlen(buf) + 1);
            
            strcpy(opts[num_opts-2], options[i].name);
            strcpy(opts[num_opts-1], buf);
        }
    }

    return opts;
}